

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O2

RBBINode * __thiscall icu_63::RBBINode::flattenVariables(RBBINode *this)

{
  RBBINode *pRVar1;
  void *in_RSI;
  
  pRVar1 = this->fLeftChild;
  if (this->fType == varRef) {
    pRVar1 = cloneTree(pRVar1);
    if (pRVar1 != (RBBINode *)0x0) {
      pRVar1->fRuleRoot = this->fRuleRoot;
      pRVar1->fChainIn = this->fChainIn;
    }
    ~RBBINode(this);
    UMemory::operator_delete((UMemory *)this,in_RSI);
    this = pRVar1;
  }
  else {
    if (pRVar1 != (RBBINode *)0x0) {
      pRVar1 = flattenVariables(pRVar1);
      this->fLeftChild = pRVar1;
      pRVar1->fParent = this;
    }
    if (this->fRightChild != (RBBINode *)0x0) {
      pRVar1 = flattenVariables(this->fRightChild);
      this->fRightChild = pRVar1;
      pRVar1->fParent = this;
    }
  }
  return this;
}

Assistant:

RBBINode *RBBINode::flattenVariables() {
    if (fType == varRef) {
        RBBINode *retNode  = fLeftChild->cloneTree();
        if (retNode != NULL) {
            retNode->fRuleRoot = this->fRuleRoot;
            retNode->fChainIn  = this->fChainIn;
        }
        delete this;   // TODO: undefined behavior. Fix.
        return retNode;
    }

    if (fLeftChild != NULL) {
        fLeftChild = fLeftChild->flattenVariables();
        fLeftChild->fParent  = this;
    }
    if (fRightChild != NULL) {
        fRightChild = fRightChild->flattenVariables();
        fRightChild->fParent = this;
    }
    return this;
}